

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cross_c.cpp
# Opt level: O1

spvc_result spvc_compiler_compile(spvc_compiler compiler,char **source)

{
  spvc_context_s *this;
  spvc_context this_00;
  char *pcVar1;
  spvc_result sVar2;
  undefined1 *puVar3;
  undefined1 *puVar4;
  string result;
  string local_a8;
  undefined1 *local_88 [2];
  undefined1 local_78 [16];
  undefined1 *local_68 [2];
  undefined1 local_58 [48];
  
  (*((compiler->compiler)._M_t.
     super___uniq_ptr_impl<spirv_cross::Compiler,_std::default_delete<spirv_cross::Compiler>_>._M_t.
     super__Tuple_impl<0UL,_spirv_cross::Compiler_*,_std::default_delete<spirv_cross::Compiler>_>.
     super__Head_base<0UL,_spirv_cross::Compiler_*,_false>._M_head_impl)->_vptr_Compiler[2])
            (&local_a8);
  this = compiler->context;
  if (local_a8._M_string_length == 0) {
    puVar4 = local_58;
    local_68[0] = puVar4;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_68,"Unsupported SPIR-V.","");
    std::__cxx11::string::operator=((string *)this,(string *)local_68);
    if (this->callback != (spvc_error_callback)0x0) {
      (*this->callback)(this->callback_userdata,(this->last_error)._M_dataplus._M_p);
    }
    sVar2 = SPVC_ERROR_UNSUPPORTED_SPIRV;
    puVar3 = local_68[0];
  }
  else {
    pcVar1 = spvc_context_s::allocate_name(this,&local_a8);
    *source = pcVar1;
    sVar2 = SPVC_SUCCESS;
    if (pcVar1 != (char *)0x0) goto LAB_00152b80;
    this_00 = compiler->context;
    puVar4 = local_78;
    local_88[0] = puVar4;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_88,"Out of memory.","");
    std::__cxx11::string::operator=((string *)this_00,(string *)local_88);
    if (this_00->callback != (spvc_error_callback)0x0) {
      (*this_00->callback)(this_00->callback_userdata,(this_00->last_error)._M_dataplus._M_p);
    }
    sVar2 = SPVC_ERROR_OUT_OF_MEMORY;
    puVar3 = local_88[0];
  }
  if (puVar3 != puVar4) {
    operator_delete(puVar3);
  }
LAB_00152b80:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
    operator_delete(local_a8._M_dataplus._M_p);
  }
  return sVar2;
}

Assistant:

spvc_result spvc_compiler_compile(spvc_compiler compiler, const char **source)
{
	SPVC_BEGIN_SAFE_SCOPE
	{
		auto result = compiler->compiler->compile();
		if (result.empty())
		{
			compiler->context->report_error("Unsupported SPIR-V.");
			return SPVC_ERROR_UNSUPPORTED_SPIRV;
		}

		*source = compiler->context->allocate_name(result);
		if (!*source)
		{
			compiler->context->report_error("Out of memory.");
			return SPVC_ERROR_OUT_OF_MEMORY;
		}
		return SPVC_SUCCESS;
	}